

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

void __thiscall wasm::Literal::Literal(Literal *this,LaneArray<2> *lanes)

{
  byte bVar1;
  byte bVar5;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  size_t lane_index;
  long lVar15;
  uint uVar16;
  int64_t iStack_48;
  array<unsigned_char,_16UL> bytes;
  uint8_t bits [16];
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  
  (this->type).id = 6;
  lVar15 = 0;
  do {
    getBits(lanes->_M_elems,(uint8_t (*) [16])(bytes._M_elems + 8));
    uVar16 = bytes._M_elems._12_4_;
    auVar13._4_4_ = bytes._M_elems._8_4_;
    auVar13._0_4_ = uVar16;
    auVar13._8_4_ = uVar16;
    auVar14._4_8_ = 0;
    auVar14._0_4_ = uVar16;
    uVar11 = bytes._M_elems._14_2_ & 0xff;
    uVar9 = bytes._M_elems._12_2_ & 0xff;
    uVar10 = bytes._M_elems._13_2_ & 0xff;
    bVar1 = ((stack0xffffffffffffffc8 & (undefined1  [16])0xff00000000) != (undefined1  [16])0x0) *
            (uVar9 < 0x100) * bytes._M_elems[0xc] - (0xff < uVar9);
    bVar2 = ((auVar14 << 0x40 & (undefined1  [12])0x0) != (undefined1  [12])0x0) * (uVar10 < 0x100)
            * bytes._M_elems[0xd] - (0xff < uVar10);
    bVar3 = ((stack0xffffffffffffffc8 & (undefined1  [16])0xff000000000000) != (undefined1  [16])0x0
            ) * (uVar11 < 0x100) * bytes._M_elems[0xe] - (0xff < uVar11);
    uVar9 = (ushort)bytes._M_elems[0xf];
    bVar4 = (uVar9 != 0) * (uVar9 < 0x100) * bytes._M_elems[0xf] - (0xff < uVar9);
    uVar11 = bytes._M_elems._10_2_ & 0xff;
    uVar12 = auVar13._7_2_ & 0xff;
    uVar9 = bytes._M_elems._8_2_ & 0xff;
    uVar10 = bytes._M_elems._9_2_ & 0xff;
    bVar5 = ((stack0xffffffffffffffc8 & (undefined1  [16])0xff) != (undefined1  [16])0x0) *
            (uVar9 < 0x100) * bytes._M_elems[8] - (0xff < uVar9);
    bVar6 = ((stack0xffffffffffffffc8 & (undefined1  [16])0xff00) != (undefined1  [16])0x0) *
            (uVar10 < 0x100) * bytes._M_elems[9] - (0xff < uVar10);
    bVar7 = ((stack0xffffffffffffffc8 & (undefined1  [16])0xff0000) != (undefined1  [16])0x0) *
            (uVar11 < 0x100) * bytes._M_elems[10] - (0xff < uVar11);
    bVar8 = ((stack0xffffffffffffffc8 & (undefined1  [16])0xff000000) != (undefined1  [16])0x0) *
            (uVar12 < 0x100) * bytes._M_elems[0xb] - (0xff < uVar12);
    bVar5 = (bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5);
    bVar6 = (bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6);
    bVar7 = (bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7);
    bVar8 = (bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8);
    bVar1 = (bVar1 != 0) * (bVar1 < 0x100) * bVar1 - (0xff < bVar1);
    bVar2 = (bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2);
    bVar3 = (bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3);
    bVar4 = (bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4);
    *(ulong *)(bytes._M_elems + lVar15 * 8 + -8) =
         CONCAT17((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                  CONCAT16((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                           CONCAT15((bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2),
                                    CONCAT14((bVar1 != 0) * (bVar1 < 0x100) * bVar1 - (0xff < bVar1)
                                             ,CONCAT13((bVar8 != 0) * (bVar8 < 0x100) * bVar8 -
                                                       (0xff < bVar8),
                                                       CONCAT12((bVar7 != 0) * (bVar7 < 0x100) *
                                                                bVar7 - (0xff < bVar7),
                                                                CONCAT11((bVar6 != 0) *
                                                                         (bVar6 < 0x100) * bVar6 -
                                                                         (0xff < bVar6),
                                                                         (bVar5 != 0) *
                                                                         (bVar5 < 0x100) * bVar5 -
                                                                         (0xff < bVar5))))))));
    lVar15 = lVar15 + 1;
    lanes = (LaneArray<2> *)((long)lanes + 0x18);
  } while (lVar15 == 1);
  (this->field_0).i64 = iStack_48;
  (this->field_0).func.super_IString.str._M_str = (char *)bytes._M_elems._0_8_;
  return;
}

Assistant:

Literal::Literal(const LaneArray<2>& lanes) : type(Type::v128) {
  extractBytes<uint64_t, 2>(v128, lanes);
}